

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::MatchLiteralNode::TransferPass1
          (MatchLiteralNode *this,Compiler *compiler,Char *litbuf)

{
  Char c;
  char16_t cVar1;
  uint uVar2;
  StandardChars<char16_t> *this_00;
  code *pcVar3;
  bool bVar4;
  MappingSource mappingSource;
  undefined4 *puVar5;
  char16_t **ppcVar6;
  uint local_2c;
  uint local_28;
  CharCount i_1;
  CharCount i;
  CharCount nextLit;
  Char *litbuf_local;
  Compiler *compiler_local;
  MatchLiteralNode *this_local;
  
  uVar2 = (compiler->program->rep).insts.litbufLen;
  if ((this->isEquivClass & 1U) == 0) {
    for (local_2c = 0; local_2c < this->length; local_2c = local_2c + 1) {
      cVar1 = litbuf[this->offset + local_2c];
      ppcVar6 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(compiler->program->rep).insts.litbuf);
      (*ppcVar6)[uVar2 + local_2c] = cVar1;
    }
    (compiler->program->rep).insts.litbufLen =
         this->length + (compiler->program->rep).insts.litbufLen;
  }
  else {
    if ((compiler->program->flags & IgnoreCaseRegexFlag) == NoRegexFlags) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x345,"((compiler.program->flags & IgnoreCaseRegexFlag) != 0)",
                         "(compiler.program->flags & IgnoreCaseRegexFlag) != 0");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    for (local_28 = 0; local_28 < this->length; local_28 = local_28 + 1) {
      this_00 = compiler->standardChars;
      mappingSource = Program::GetCaseMappingSource(compiler->program);
      c = litbuf[this->offset + local_28];
      ppcVar6 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(compiler->program->rep).insts.litbuf);
      StandardChars<char16_t>::ToEquivs
                (this_00,mappingSource,c,*ppcVar6 + (ulong)uVar2 + (ulong)(local_28 << 2));
    }
    (compiler->program->rep).insts.litbufLen =
         this->length * 4 + (compiler->program->rep).insts.litbufLen;
  }
  this->offset = uVar2;
  return;
}

Assistant:

void MatchLiteralNode::TransferPass1(Compiler& compiler, const Char* litbuf)
    {
        CharCount nextLit = compiler.program->rep.insts.litbufLen;
        if (isEquivClass)
        {
            Assert((compiler.program->flags & IgnoreCaseRegexFlag) != 0);
            // Expand literal according to character equivalence classes
            for (CharCount i = 0; i < length; i++)
            {
                compiler.standardChars->ToEquivs(
                    compiler.program->GetCaseMappingSource(),
                    litbuf[offset + i],
                    compiler.program->rep.insts.litbuf + nextLit + i * CaseInsensitive::EquivClassSize);
            }
            compiler.program->rep.insts.litbufLen += length * CaseInsensitive::EquivClassSize;
        }
        else
        {
            for (CharCount i = 0; i < length; i++)
                compiler.program->rep.insts.litbuf[nextLit + i] = litbuf[offset + i];
            compiler.program->rep.insts.litbufLen += length;
        }
        offset = nextLit;
    }